

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O1

DWORD * __thiscall
XMISong::MakeEvents(XMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  uint uVar1;
  AutoNoteOff *pAVar2;
  DWORD *pDVar3;
  DWORD *unaff_RBX;
  DWORD *pDVar4;
  DWORD DVar5;
  DWORD DVar6;
  uint uVar7;
  EventSource EVar8;
  bool bVar9;
  bool sysex_noroom;
  bool local_41;
  DWORD local_40;
  uint local_3c;
  DWORD *local_38;
  
  if ((max_event_p <= events) || (this->EventDue == EVENT_None)) {
    return events;
  }
  local_3c = 0;
  DVar5 = 0;
  local_40 = max_time;
  local_38 = events;
LAB_0033a9bf:
  if (this->EventDue == EVENT_Real) {
    pAVar2 = (AutoNoteOff *)&this->CurrSong->Delay;
  }
  else {
    pAVar2 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
  }
  DVar6 = pAVar2->Delay;
  DVar5 = DVar5 + DVar6;
  local_3c = local_3c +
             ((this->super_MIDIStreamer).Tempo * DVar6) / (uint)(this->super_MIDIStreamer).Division;
  AdvanceSong(this,DVar6);
  pDVar4 = unaff_RBX;
  DVar6 = DVar5;
  do {
    unaff_RBX = events;
    local_41 = false;
    pDVar3 = SendCommand(this,unaff_RBX,this->EventDue,DVar5,
                         (long)max_event_p - (long)unaff_RBX >> 2,&local_41);
    events = unaff_RBX;
    if (local_41 == false) {
      bVar9 = this->CurrSong->Finished;
      uVar1 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count;
      EVar8 = EVENT_None;
      if ((bVar9 & uVar1 == 0) == 0) {
        uVar7 = 0xffffffff;
        DVar5 = 0xffffffff;
        if (bVar9 == false) {
          DVar5 = this->CurrSong->Delay;
        }
        if (uVar1 != 0) {
          uVar7 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
        }
        EVar8 = EVENT_Fake - (DVar5 < uVar7);
      }
      this->EventDue = EVar8;
      bVar9 = pDVar3 != unaff_RBX;
      unaff_RBX = pDVar4;
      events = pDVar3;
      DVar5 = DVar6;
      if (bVar9) {
        DVar5 = 0;
        DVar6 = 0;
      }
    }
    if (local_41 != false) {
      return unaff_RBX;
    }
    EVar8 = this->EventDue;
    if (EVar8 == EVENT_Real) {
      pAVar2 = (AutoNoteOff *)&this->CurrSong->Delay;
    }
    else {
      if (EVar8 == EVENT_None) break;
      pAVar2 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
    }
    if ((max_event_p <= events) || (pDVar4 = unaff_RBX, pAVar2->Delay != 0)) break;
  } while( true );
  if (events != local_38 || EVar8 == EVENT_None) {
    if (max_event_p <= events) {
      return events;
    }
    if (this->EventDue == EVENT_None) {
      return events;
    }
    DVar5 = 0;
    if (local_40 < local_3c) {
      return events;
    }
  }
  goto LAB_0033a9bf;
}

Assistant:

DWORD *XMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (EventDue != EVENT_None && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = GET_DELAY;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceSong(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, EventDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				EventDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (EventDue != EVENT_None && GET_DELAY == 0 && events < max_event_p);
		}
		while (start_events == events && EventDue != EVENT_None);
		time = 0;
	}
	return events;
}